

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::iterator,_bool>
* __thiscall
phmap::priv::
parallel_hash_map<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
::try_emplace_impl_with_hash<int_const&>
          (pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          parallel_hash_map<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
          *this,size_t hashval,int *k)

{
  size_t sVar1;
  raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  *prVar2;
  ctrl_t h;
  __tuple_element_t<0UL,_tuple<Inner_*,_unsigned_long,_bool>_>_conflict3 *ppIVar3;
  __tuple_element_t<2UL,_tuple<Inner_*,_unsigned_long,_bool>_> *p_Var4;
  __tuple_element_t<1UL,_tuple<Inner_*,_unsigned_long,_bool>_> *p_Var5;
  iterator local_98;
  iterator local_88;
  tuple<> local_51;
  tuple<const_int_&> local_50;
  raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  *local_48;
  Inner *inner;
  tuple<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::Inner_*,_unsigned_long,_bool>
  res;
  UniqueLock m;
  int *k_local;
  size_t hashval_local;
  parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  *this_local;
  
  LockableBaseImpl<phmap::NullMutex>::DoNothing::DoNothing
            ((DoNothing *)
             ((long)&res.
                     super__Tuple_impl<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::Inner_*,_unsigned_long,_bool>
                     .
                     super__Head_base<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::Inner_*,_false>
                     ._M_head_impl + 7));
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  ::find_or_prepare_insert_with_hash<int>
            ((tuple<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::Inner_*,_unsigned_long,_bool>
              *)&inner,
             (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
              *)this,hashval,k,
             (UniqueLock *)
             ((long)&res.
                     super__Tuple_impl<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::Inner_*,_unsigned_long,_bool>
                     .
                     super__Head_base<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::Inner_*,_false>
                     ._M_head_impl + 7));
  ppIVar3 = std::
            get<0ul,phmap::priv::parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>::Inner*,unsigned_long,bool>
                      ((tuple<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::Inner_*,_unsigned_long,_bool>
                        *)&inner);
  local_48 = &(*ppIVar3)->set_;
  p_Var4 = std::
           get<2ul,phmap::priv::parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>::Inner*,unsigned_long,bool>
                     ((tuple<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::Inner_*,_unsigned_long,_bool>
                       *)&inner);
  prVar2 = local_48;
  if ((*p_Var4 & 1U) != 0) {
    p_Var5 = std::
             get<1ul,phmap::priv::parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>::Inner*,unsigned_long,bool>
                       ((tuple<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::Inner_*,_unsigned_long,_bool>
                         *)&inner);
    sVar1 = *p_Var5;
    std::forward_as_tuple<int_const&>((int *)&local_50);
    std::forward_as_tuple<>();
    raw_hash_set<phmap::priv::NodeHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
    ::emplace_at<std::piecewise_construct_t_const&,std::tuple<int_const&>,std::tuple<>>
              ((raw_hash_set<phmap::priv::NodeHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
                *)prVar2,sVar1,(piecewise_construct_t *)&std::piecewise_construct,&local_50,
               &local_51);
    prVar2 = local_48;
    p_Var5 = std::
             get<1ul,phmap::priv::parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>::Inner*,unsigned_long,bool>
                       ((tuple<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::Inner_*,_unsigned_long,_bool>
                         *)&inner);
    sVar1 = *p_Var5;
    h = H2(hashval);
    raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
    ::set_ctrl(prVar2,sVar1,h);
  }
  prVar2 = local_48;
  p_Var5 = std::
           get<1ul,phmap::priv::parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>::Inner*,unsigned_long,bool>
                     ((tuple<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::Inner_*,_unsigned_long,_bool>
                       *)&inner);
  local_98 = raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
             ::iterator_at(prVar2,*p_Var5);
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  ::iterator_at(&local_88,
                (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                 *)this,(Inner *)prVar2,&local_98);
  p_Var4 = std::
           get<2ul,phmap::priv::parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>::Inner*,unsigned_long,bool>
                     ((tuple<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::Inner_*,_unsigned_long,_bool>
                       *)&inner);
  std::
  pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::iterator,_bool>
  ::
  pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::iterator,_bool_&,_true>
            (__return_storage_ptr__,&local_88,p_Var4);
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace_impl_with_hash(size_t hashval, K&& k, Args&&... args) {
        UniqueLock m;
        auto res = this->find_or_prepare_insert_with_hash(hashval, k, m);
        typename Base::Inner *inner = std::get<0>(res);
        if (std::get<2>(res)) {
            inner->set_.emplace_at(std::get<1>(res), std::piecewise_construct,
                                   std::forward_as_tuple(std::forward<K>(k)),
                                   std::forward_as_tuple(std::forward<Args>(args)...));
            inner->set_.set_ctrl(std::get<1>(res), H2(hashval));
        }
        return {this->iterator_at(inner, inner->set_.iterator_at(std::get<1>(res))), 
                std::get<2>(res)};
    }